

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::AssertionResult::getExpression_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResult *this)

{
  string *__rhs;
  
  __rhs = &(this->m_info).capturedExpression;
  if (((this->m_info).resultDisposition & FalseTest) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__rhs);
  }
  else {
    std::operator+(__return_storage_ptr__,"!",__rhs);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResult::getExpression() const {
		if (isFalseTest(m_info.resultDisposition))
			return "!" + m_info.capturedExpression;
		else
			return m_info.capturedExpression;
	}